

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O2

ENetPeer *
enet_host_connect(ENetHost *host,ENetAddress *address,size_t channelCount,enet_uint32 data)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  ENetPeer *pEVar4;
  ENetChannel *pEVar5;
  enet_uint32 eVar6;
  uint uVar7;
  size_t sVar8;
  ENetChannel *pEVar9;
  ENetProtocol command;
  
  sVar2 = 0xff;
  if (channelCount < 0xff) {
    sVar2 = channelCount;
  }
  sVar8 = 1;
  if (channelCount != 0) {
    sVar8 = sVar2;
  }
  uVar1 = host->peerCount;
  uVar3 = 0;
  do {
    if (uVar1 == uVar3) {
      if (0xfffffe < uVar1) {
        return (ENetPeer *)0x0;
      }
      host->peerCount = uVar1 + 1;
      pEVar4 = (ENetPeer *)enet_malloc(0x1d8);
      host->peer_list[uVar1] = pEVar4;
      memset(host->peer_list[uVar1],0,0x1d8);
      pEVar4 = host->peer_list[uVar1];
      pEVar4->host = host;
      pEVar4->incomingPeerID = (enet_uint32)uVar1;
      pEVar4->outgoingSessionID = 0xff;
      pEVar4->incomingSessionID = 0xff;
      pEVar4->data = (void *)0x0;
      enet_list_clear(&pEVar4->acknowledgements);
      enet_list_clear(&pEVar4->sentReliableCommands);
      enet_list_clear(&pEVar4->sentUnreliableCommands);
      enet_list_clear(&pEVar4->outgoingReliableCommands);
      enet_list_clear(&pEVar4->outgoingUnreliableCommands);
      enet_list_clear(&pEVar4->dispatchedCommands);
      enet_peer_reset(pEVar4);
      break;
    }
    pEVar4 = host->peer_list[uVar3];
    uVar3 = uVar3 + 1;
  } while (pEVar4->state != ENET_PEER_STATE_DISCONNECTED);
  pEVar5 = (ENetChannel *)enet_malloc(sVar8 * 0x50);
  pEVar4->channels = pEVar5;
  if (pEVar5 == (ENetChannel *)0x0) {
    return (ENetPeer *)0x0;
  }
  pEVar4->channelCount = sVar8;
  pEVar4->state = ENET_PEER_STATE_CONNECTING;
  pEVar4->address = *address;
  eVar6 = host->randomSeed + 1;
  host->randomSeed = eVar6;
  pEVar4->connectID = eVar6;
  pEVar9 = pEVar5;
  if (host->outgoingBandwidth != 0) {
    uVar7 = host->outgoingBandwidth >> 4 & 0xffff000;
    pEVar4->windowSize = uVar7;
    if (uVar7 == 0) {
      pEVar4->windowSize = 0x1000;
      goto LAB_00103979;
    }
    if (uVar7 < 0x10001) goto LAB_00103979;
  }
  pEVar4->windowSize = 0x10000;
LAB_00103979:
  for (; pEVar9 < pEVar5 + sVar8; pEVar9 = pEVar9 + 1) {
    pEVar9->outgoingReliableSequenceNumber = 0;
    pEVar9->outgoingUnreliableSequenceNumber = 0;
    pEVar9->incomingReliableSequenceNumber = 0;
    pEVar9->incomingUnreliableSequenceNumber = 0;
    enet_list_clear(&pEVar9->incomingReliableCommands);
    enet_list_clear(&pEVar9->incomingUnreliableCommands);
    pEVar9->reliableWindows[0xf] = 0;
    pEVar9->reliableWindows[7] = 0;
    pEVar9->reliableWindows[8] = 0;
    pEVar9->reliableWindows[9] = 0;
    pEVar9->reliableWindows[10] = 0;
    pEVar9->reliableWindows[0xb] = 0;
    pEVar9->reliableWindows[0xc] = 0;
    pEVar9->reliableWindows[0xd] = 0;
    pEVar9->reliableWindows[0xe] = 0;
    pEVar9->usedReliableWindows = 0;
    pEVar9->reliableWindows[0] = 0;
    pEVar9->reliableWindows[1] = 0;
    pEVar9->reliableWindows[2] = 0;
    pEVar9->reliableWindows[3] = 0;
    pEVar9->reliableWindows[4] = 0;
    pEVar9->reliableWindows[5] = 0;
    pEVar9->reliableWindows[6] = 0;
    pEVar5 = pEVar4->channels;
  }
  command._0_2_ = 0xff82;
  uVar7 = pEVar4->incomingPeerID;
  command.connect.outgoingPeerID =
       uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  command.connect.incomingSessionID = pEVar4->incomingSessionID;
  command.connect.outgoingSessionID = pEVar4->outgoingSessionID;
  uVar7 = pEVar4->mtu;
  command.connect.mtu =
       uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  uVar7 = pEVar4->windowSize;
  command.connect.windowSize =
       uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  command.connect.channelCount = (int)sVar8 << 0x18;
  uVar7 = host->incomingBandwidth;
  command.connect.incomingBandwidth =
       uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  uVar7 = host->outgoingBandwidth;
  command.connect.outgoingBandwidth =
       uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  uVar7 = pEVar4->packetThrottleInterval;
  command.connect.packetThrottleInterval =
       uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  uVar7 = pEVar4->packetThrottleAcceleration;
  command.connect.packetThrottleAcceleration =
       uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  uVar7 = pEVar4->packetThrottleDeceleration;
  command.connect.packetThrottleDeceleration =
       uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  command.connect.connectID = pEVar4->connectID;
  command.connect.data = data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18
  ;
  enet_peer_queue_outgoing_command(pEVar4,&command,(ENetPacket *)0x0,0,0);
  return pEVar4;
}

Assistant:

ENetPeer *
enet_host_connect (ENetHost * host, const ENetAddress * address, size_t channelCount, enet_uint32 data)
{
    ENetPeer * currentPeer;
    ENetChannel * channel;
    ENetProtocol command;
    int i;

    if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
      channelCount = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;
    else
    if (channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
      channelCount = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;

    for (i = 0; i < host -> peerCount; i++ )
    {
       currentPeer = host -> peer_list[i];

       if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED)
         break;
    }

    if (i >= host -> peerCount)
    {
	if (i >= ENET_PROTOCOL_MAXIMUM_PEER_ID) 
	    return NULL;
	host -> peerCount++;
	host -> peer_list[i] = enet_malloc (sizeof (ENetPeer));
	memset (host -> peer_list[i], 0, sizeof (ENetPeer));
	currentPeer = host->peer_list[i];
	currentPeer -> host = host;
	currentPeer -> incomingPeerID = i;
	currentPeer -> outgoingSessionID = currentPeer -> incomingSessionID = 0xFF;
	currentPeer -> data = NULL;

	enet_list_clear (& currentPeer -> acknowledgements);
	enet_list_clear (& currentPeer -> sentReliableCommands);
	enet_list_clear (& currentPeer -> sentUnreliableCommands);
	enet_list_clear (& currentPeer -> outgoingReliableCommands);
	enet_list_clear (& currentPeer -> outgoingUnreliableCommands);
	enet_list_clear (& currentPeer -> dispatchedCommands);

	enet_peer_reset (currentPeer);
    }

    currentPeer -> channels = (ENetChannel *) enet_malloc (channelCount * sizeof (ENetChannel));
    if (currentPeer -> channels == NULL)
      return NULL;
    currentPeer -> channelCount = channelCount;
    currentPeer -> state = ENET_PEER_STATE_CONNECTING;
    currentPeer -> address = * address;
    currentPeer -> connectID = ++ host -> randomSeed;

    if (host -> outgoingBandwidth == 0)
      currentPeer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
    else
      currentPeer -> windowSize = (host -> outgoingBandwidth /
                                    ENET_PEER_WINDOW_SIZE_SCALE) * 
                                      ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

    if (currentPeer -> windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
      currentPeer -> windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
    else
    if (currentPeer -> windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
      currentPeer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
         
    for (channel = currentPeer -> channels;
         channel < & currentPeer -> channels [channelCount];
         ++ channel)
    {
        channel -> outgoingReliableSequenceNumber = 0;
        channel -> outgoingUnreliableSequenceNumber = 0;
        channel -> incomingReliableSequenceNumber = 0;
        channel -> incomingUnreliableSequenceNumber = 0;

        enet_list_clear (& channel -> incomingReliableCommands);
        enet_list_clear (& channel -> incomingUnreliableCommands);

        channel -> usedReliableWindows = 0;
        memset (channel -> reliableWindows, 0, sizeof (channel -> reliableWindows));
    }
        
    command.header.command = ENET_PROTOCOL_COMMAND_CONNECT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
    command.header.channelID = 0xFF;
    command.connect.outgoingPeerID = ENET_HOST_TO_NET_32 (currentPeer -> incomingPeerID);
    command.connect.incomingSessionID = currentPeer -> incomingSessionID;
    command.connect.outgoingSessionID = currentPeer -> outgoingSessionID;
    command.connect.mtu = ENET_HOST_TO_NET_32 (currentPeer -> mtu);
    command.connect.windowSize = ENET_HOST_TO_NET_32 (currentPeer -> windowSize);
    command.connect.channelCount = ENET_HOST_TO_NET_32 (channelCount);
    command.connect.incomingBandwidth = ENET_HOST_TO_NET_32 (host -> incomingBandwidth);
    command.connect.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);
    command.connect.packetThrottleInterval = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleInterval);
    command.connect.packetThrottleAcceleration = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleAcceleration);
    command.connect.packetThrottleDeceleration = ENET_HOST_TO_NET_32 (currentPeer -> packetThrottleDeceleration);
    command.connect.connectID = currentPeer -> connectID;
    command.connect.data = ENET_HOST_TO_NET_32 (data);
 
    enet_peer_queue_outgoing_command (currentPeer, & command, NULL, 0, 0);

    return currentPeer;
}